

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::setDomainChangeStack
          (HighsDomain *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack,
          vector<int,_std::allocator<int>_> *branchingPositions)

{
  double *pdVar1;
  HighsDomainChange *pHVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  HighsBoundType HVar7;
  pointer pHVar8;
  pointer pHVar9;
  pointer piVar10;
  pointer ppVar11;
  pointer pRVar12;
  int *piVar13;
  bool bVar14;
  char cVar15;
  int iVar16;
  pointer piVar17;
  iterator __begin2;
  pointer pHVar18;
  pointer piVar19;
  int *piVar20;
  long lVar21;
  bool bVar22;
  HighsDomainChange boundchg;
  int local_40;
  
  this->infeasible_ = false;
  pHVar8 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar9 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar8 != pHVar9) {
    piVar17 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar10 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pHVar18 = pHVar8;
    do {
      piVar19 = piVar10;
      if (pHVar18->boundtype == kLower) {
        piVar19 = piVar17;
      }
      piVar19[pHVar18->column] = -1;
      pHVar18 = pHVar18 + 1;
    } while (pHVar18 != pHVar9);
  }
  ppVar11 = (this->prevboundval_).
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar11) {
    (this->prevboundval_).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar11;
  }
  if (pHVar8 != pHVar9) {
    (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar8;
  }
  pRVar12 = (this->domchgreason_).
            super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar12) {
    (this->domchgreason_).
    super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar12;
  }
  piVar17 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar17) {
    (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar17;
  }
  piVar20 = (branchingPositions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar13 = (branchingPositions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  bVar22 = piVar20 == piVar13;
  local_40 = (int)((ulong)((long)(domchgstack->
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(domchgstack->
                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (bVar22) {
    iVar16 = 0;
  }
  else {
    iVar16 = 0;
    do {
      iVar5 = *piVar20;
      if (iVar16 < iVar5) {
        lVar21 = (long)iVar16 << 4;
        do {
          pHVar8 = (domchgstack->
                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          iVar6 = *(int *)((long)&pHVar8->boundtype + lVar21);
          if (iVar6 == 1) {
            if (*(double *)((long)&pHVar8->boundval + lVar21) <
                (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[*(int *)((long)&pHVar8->column + lVar21)])
            goto LAB_0029af28;
          }
          else if ((iVar6 != 0) ||
                  ((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[*(int *)((long)&pHVar8->column + lVar21)] <
                   *(double *)((long)&pHVar8->boundval + lVar21))) {
LAB_0029af28:
            boundchg._8_8_ = *(undefined8 *)((long)&pHVar8->column + lVar21);
            boundchg.boundval = *(double *)((long)&pHVar8->boundval + lVar21);
            changeBound(this,boundchg,(Reason)0xfffffffe);
            if (this->infeasible_ == false) {
              propagate(this);
            }
            if (this->infeasible_ != false) {
              cVar15 = '\x01';
              goto LAB_0029b016;
            }
          }
          iVar16 = iVar16 + 1;
          lVar21 = lVar21 + 0x10;
        } while (iVar5 != iVar16);
      }
      cVar15 = '\x01';
      if (iVar16 != local_40) {
        pHVar8 = (domchgstack->
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar3 = pHVar8[iVar16].boundval;
        iVar5 = pHVar8[iVar16].column;
        if (pHVar8[iVar16].boundtype == kLower) {
          dVar4 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar5];
          if (dVar4 < dVar3) goto LAB_0029afe0;
          cVar15 = '\x05';
          if (dVar4 <= dVar3) {
            piVar17 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            goto LAB_0029afda;
          }
        }
        else {
          pdVar1 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar5;
          bVar14 = dVar3 < *pdVar1;
          if (bVar14) {
LAB_0029afe0:
            changeBound(this,pHVar8[iVar16],(Reason)0xffffffff);
            if (this->infeasible_ == false) {
              propagate(this);
            }
            cVar15 = this->infeasible_;
          }
          else {
            cVar15 = '\x05';
            if (bVar14 || dVar3 == *pdVar1) {
              piVar17 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
LAB_0029afda:
              cVar15 = '\x05';
              if (piVar17[iVar5] == -1) goto LAB_0029afe0;
            }
          }
        }
      }
LAB_0029b016:
      if ((cVar15 != '\x05') && (cVar15 != '\0')) break;
      piVar20 = piVar20 + 1;
      bVar22 = piVar20 == piVar13;
    } while (!bVar22);
  }
  if (bVar22) {
    for (; iVar16 < local_40; iVar16 = iVar16 + 1) {
      pHVar8 = (domchgstack->
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pHVar2 = pHVar8 + iVar16;
      HVar7 = pHVar8[iVar16].boundtype;
      if (HVar7 == kUpper) {
        if (pHVar2->boundval <
            (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[pHVar2->column]) goto LAB_0029b09d;
      }
      else if ((HVar7 != kLower) ||
              ((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[pHVar2->column] < pHVar2->boundval)) {
LAB_0029b09d:
        changeBound(this,*pHVar2,(Reason)0xfffffffe);
        if (this->infeasible_ == false) {
          propagate(this);
        }
        if (this->infeasible_ != false) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::setDomainChangeStack(
    const std::vector<HighsDomainChange>& domchgstack,
    const std::vector<HighsInt>& branchingPositions) {
  infeasible_ = false;
  mipsolver->mipdata_->debugSolution.resetDomain(*this);

  if (!domchgstack_.empty()) {
    for (const HighsDomainChange& domchg : domchgstack_) {
      if (domchg.boundtype == HighsBoundType::kLower)
        colLowerPos_[domchg.column] = -1;
      else
        colUpperPos_[domchg.column] = -1;
    }
  }

  prevboundval_.clear();
  domchgstack_.clear();
  domchgreason_.clear();
  branchPos_.clear();
  HighsInt stacksize = domchgstack.size();
  HighsInt k = 0;
  for (HighsInt branchPos : branchingPositions) {
    for (; k < branchPos; ++k) {
      if (domchgstack[k].boundtype == HighsBoundType::kLower &&
          domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
        continue;
      if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
          domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
        continue;

      changeBound(domchgstack[k], Reason::unspecified());
      if (!infeasible_) propagate();
      if (infeasible_) return;
    }

    if (k == stacksize) return;

    // For redundant branching bound changes we need to be more careful due to
    // symmetry handling. If these bound changes are redundant simply because
    // the corresponding subtree was enumerated and hence the global bound
    // updated, then we still need to keep their status as branching variables
    // for computing correct stabilizers. They can, however, be safely dropped
    // if they are either strictly redundant in the global domain, or if there
    // is already a local bound change that makes the branching change
    // redundant.
    if (domchgstack[k].boundtype == HighsBoundType::kLower) {
      if (domchgstack[k].boundval <= col_lower_[domchgstack[k].column]) {
        if (domchgstack[k].boundval < col_lower_[domchgstack[k].column])
          continue;
        if (colLowerPos_[domchgstack[k].column] != -1) continue;
      }
    } else {
      if (domchgstack[k].boundval >= col_upper_[domchgstack[k].column]) {
        if (domchgstack[k].boundval > col_upper_[domchgstack[k].column])
          continue;
        if (colUpperPos_[domchgstack[k].column] != -1) continue;
      }
    }

    changeBound(domchgstack[k], Reason::branching());
    if (!infeasible_) propagate();
    if (infeasible_) return;
  }

  for (; k < stacksize; ++k) {
    if (domchgstack[k].boundtype == HighsBoundType::kLower &&
        domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
      continue;
    if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
        domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
      continue;

    mipsolver->mipdata_->debugSolution.boundChangeAdded(*this, domchgstack[k],
                                                        true);

    changeBound(domchgstack[k], Reason::unspecified());
    if (!infeasible_) propagate();
    if (infeasible_) break;
  }
}